

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O1

bool __thiscall
(anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer::
handleChild(wasm::Expression*&,wasm::Expression__unsigned_int_
          (void *this,Expression **child,Expression *parent,Index fieldIndex)

{
  long lVar1;
  undefined8 *puVar2;
  Module *module;
  unique_ptr *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Type TVar6;
  char *pcVar7;
  bool bVar8;
  size_type sVar9;
  undefined1 *puVar10;
  long lVar11;
  Block *pBVar12;
  Expression *item;
  Const *pCVar13;
  HeapType type;
  Expression *pEVar14;
  undefined4 in_register_0000000c;
  undefined8 uVar15;
  ulong uVar16;
  MixedArena *this_00;
  Name NVar17;
  Name NVar18;
  optional<wasm::Type> type_00;
  IString IVar19;
  Type local_98 [2];
  Builder local_88;
  Builder builder;
  Expression local_68;
  long local_58;
  HeapType local_50;
  char *local_48;
  Index local_3c;
  Function *local_38;
  
  uVar15 = CONCAT44(in_register_0000000c,fieldIndex);
  pEVar14 = *child;
  if (((pEVar14 == (Expression *)0x0) || (pEVar14->_id != GlobalGetId)) ||
     (sVar9 = std::
              _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::count(*(_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        **)((long)this + 0xe8),(key_type *)(pEVar14 + 1)), sVar9 != 0)) {
    bVar8 = false;
  }
  else {
    local_3c = fieldIndex;
    bVar8 = anon_unknown.dwarf_5f699::isNullableAndMutable(parent,fieldIndex);
    if (!bVar8) {
      __assert_fail("isNullableAndMutable(parent, fieldIndex)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-ctor-eval.cpp"
                    ,0x2ec,
                    "bool (anonymous namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer::handleChild(Expression *&, Expression *, Index)"
                   );
    }
    lVar1 = *(long *)((long)this + 0xd8);
    puVar2 = (undefined8 *)**(long **)((long)this + 0xe0);
    uVar4 = *puVar2;
    uVar5 = puVar2[1];
    local_98[0].id = puVar2[7];
    if (*(char *)(lVar1 + 0x108) == '\0') {
      local_88.wasm = *(Module **)(lVar1 + 8);
      this_00 = &(local_88.wasm)->allocator;
      puVar10 = (undefined1 *)MixedArena::allocSpace(this_00,0x40,8);
      uVar16 = CONCAT71((int7)((ulong)uVar15 >> 8),1);
      *puVar10 = 1;
      *(undefined8 *)(puVar10 + 8) = 0;
      *(undefined8 *)(puVar10 + 0x10) = 0;
      *(undefined8 *)(puVar10 + 0x18) = 0;
      *(undefined8 *)(puVar10 + 0x20) = 0;
      *(undefined8 *)(puVar10 + 0x28) = 0;
      *(undefined8 *)(puVar10 + 0x30) = 0;
      *(MixedArena **)(puVar10 + 0x38) = this_00;
      *(undefined1 **)(lVar1 + 0x100) = puVar10;
      *(undefined1 *)(lVar1 + 0x108) = 1;
      module = *(Module **)(lVar1 + 8);
      if ((module->start).super_IString.str._M_str == (char *)0x0) {
        NVar17.super_IString.str = (IString)wasm::IString::interned(5,"start",0);
        IVar19.str = (string_view)wasm::Names::getValidFunctionName(module,NVar17);
        ((IString *)(*(long *)(lVar1 + 8) + 0xc0))->str = IVar19.str;
        puVar3 = *(unique_ptr **)(lVar1 + 8);
        local_48 = *(char **)(puVar3 + 0xc0);
        local_50.id = *(uintptr_t *)(puVar3 + 200);
        wasm::HeapType::HeapType((HeapType *)&builder,(Signature)ZEXT816(0));
        local_68._0_8_ = (Module *)0x0;
        local_68.type.id = 0;
        local_58 = 0;
        NVar17.super_IString.str._M_str = local_48;
        NVar17.super_IString.str._M_len = (size_t)&local_38;
        wasm::Builder::makeFunction
                  (NVar17,local_50,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)builder.wasm,
                   &local_68);
        wasm::Module::addFunction(puVar3);
        if (local_38 != (Function *)0x0) {
          std::default_delete<wasm::Function>::operator()
                    ((default_delete<wasm::Function> *)&local_38,local_38);
        }
        local_38 = (Function *)0x0;
        if ((Module *)local_68._0_8_ != (Module *)0x0) {
          operator_delete((void *)local_68._0_8_,local_58 - local_68._0_8_);
        }
      }
      else {
        NVar18.super_IString.str._M_str = (char *)(module->start).super_IString.str._M_len;
        NVar18.super_IString.str._M_len = (size_t)module;
        lVar11 = wasm::Module::getFunction(NVar18);
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar16;
        pBVar12 = wasm::Builder::makeSequence
                            (&local_88,*(Expression **)(lVar1 + 0x100),
                             *(Expression **)(lVar11 + 0x60),type_00);
        *(Block **)(lVar11 + 0x60) = pBVar12;
      }
    }
    TVar6.id = local_98[0].id;
    local_68._0_8_ = *(long *)(lVar1 + 8);
    local_50.id = uVar5;
    local_48 = (char *)this;
    puVar10 = (undefined1 *)MixedArena::allocSpace(&((Module *)local_68._0_8_)->allocator,0x20,8);
    *puVar10 = 10;
    *(undefined8 *)(puVar10 + 8) = 0;
    *(undefined8 *)(puVar10 + 0x10) = 0;
    *(undefined8 *)(puVar10 + 0x10) = uVar4;
    *(uintptr_t *)(puVar10 + 0x18) = local_50.id;
    *(uintptr_t *)(puVar10 + 8) = TVar6.id;
    bVar8 = wasm::Type::isStruct(local_98);
    if (bVar8) {
      item = (Expression *)MixedArena::allocSpace((MixedArena *)(local_68._0_8_ + 0x200),0x30,8);
      item->_id = StructSetId;
      (item->type).id = 0;
      *(undefined4 *)&item[2].type.id = 0;
      *(Index *)(item + 1) = local_3c;
      item[1].type.id = (uintptr_t)puVar10;
      *(Expression **)(item + 2) = pEVar14;
      wasm::StructSet::finalize();
    }
    else {
      pCVar13 = wasm::Builder::makeConst<int>((Builder *)&local_68,local_3c);
      item = (Expression *)MixedArena::allocSpace((MixedArena *)(local_68._0_8_ + 0x200),0x28,8);
      item->_id = ArraySetId;
      (item->type).id = 0;
      *(undefined1 **)(item + 1) = puVar10;
      item[1].type.id = (uintptr_t)pCVar13;
      *(Expression **)(item + 2) = pEVar14;
      wasm::ArraySet::finalize();
    }
    pcVar7 = local_48;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
               (*(long *)(lVar1 + 0x100) + 0x20),item);
    local_68._0_8_ = *(undefined8 *)((long)pcVar7 + 0xd0);
    type = wasm::Type::getHeapType(&pEVar14->type);
    pEVar14 = (Expression *)wasm::Builder::makeRefNull((Builder *)&local_68,type);
    *child = pEVar14;
    bVar8 = true;
  }
  return bVar8;
}

Assistant:

bool handleChild(Expression*& child,
                         Expression* parent,
                         Index fieldIndex = 0) {
          if (!child) {
            return false;
          }

          if (auto* get = child->dynCast<GlobalGet>()) {
            if (!readableGlobals.count(get->name)) {
              // This get cannot be read - it is a global that appears after
              // us - and so we must fix it up, using the method mentioned
              // before (setting it to null now, and later in the start
              // function writing to it).
              assert(isNullableAndMutable(parent, fieldIndex));
              evaller.addStartFixup(
                {global->name, global->type}, fieldIndex, get);
              child =
                Builder(*getModule()).makeRefNull(get->type.getHeapType());
              return true;
            }
          }

          return false;
        }